

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall
QWidgetPrivate::reparentWidgetWindowChildren(QWidgetPrivate *this,QWidget *parentWithWindow)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  lVar1 = *(long *)&this->field_0x20;
  lVar2 = *(long *)&this->field_0x28;
  for (lVar4 = 0; lVar2 << 3 != lVar4; lVar4 = lVar4 + 8) {
    lVar3 = *(long *)(lVar1 + lVar4);
    if ((lVar3 != 0) && (((*(QWidgetPrivate **)(lVar3 + 8))->field_0x30 & 1) != 0)) {
      reparentWidgetWindows
                (*(QWidgetPrivate **)(lVar3 + 8),parentWithWindow,
                 (QFlagsStorageHelper<Qt::WindowType,_4>)
                 ((QFlagsStorageHelper<Qt::WindowType,_4> *)(*(long *)(lVar3 + 0x20) + 0xc))->
                 super_QFlagsStorage<Qt::WindowType>);
    }
  }
  return;
}

Assistant:

void QWidgetPrivate::reparentWidgetWindowChildren(QWidget *parentWithWindow)
{
    for (auto *child : std::as_const(children)) {
        if (auto *childWidget = qobject_cast<QWidget*>(child)) {
            auto *childPrivate = QWidgetPrivate::get(childWidget);
            // Child widgets with QWindows should always continue to be child
            // windows, so we pass on the child's current window flags here.
            childPrivate->reparentWidgetWindows(parentWithWindow, childWidget->windowFlags());
        }
    }
}